

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DefParamSymbol * __thiscall
slang::BumpAllocator::emplace<slang::ast::DefParamSymbol,slang::SourceLocation>
          (BumpAllocator *this,SourceLocation *args)

{
  DefParamSymbol *pDVar1;
  size_t in_RSI;
  DefParamSymbol *in_RDI;
  SourceLocation unaff_retaddr;
  size_t in_stack_ffffffffffffffe8;
  
  pDVar1 = (DefParamSymbol *)allocate((BumpAllocator *)in_RDI,in_RSI,in_stack_ffffffffffffffe8);
  ast::DefParamSymbol::DefParamSymbol(in_RDI,unaff_retaddr);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }